

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_do_pps_send(lws *wsi)

{
  undefined1 *puVar1;
  uchar *buf;
  uint8_t uVar2;
  lws_h2_netconn *plVar3;
  lws_h2_netconn *plVar4;
  undefined8 uVar5;
  lws_h2_protocol_send *plVar6;
  lws_h2_protocol_send *plVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  lws *plVar11;
  lws_h2_protocol_send *plVar12;
  ulong uVar13;
  lws_h2_protocol_send **pplVar14;
  lws_h2_protocol_send *ptr;
  int iVar15;
  char *format;
  long lVar16;
  uint8_t set [80];
  
  plVar3 = (wsi->h2).h2n;
  if (plVar3 == (lws_h2_netconn *)0x0) {
    return 1;
  }
  buf = set + 0x10;
  plVar6 = plVar3->pps;
  plVar7 = (lws_h2_protocol_send *)&plVar3->pps;
  ptr = (lws_h2_protocol_send *)(lws_h2_protocol_send **)0x0;
  while (pplVar14 = &plVar7->next, plVar12 = plVar6, plVar12 != (lws_h2_protocol_send *)0x0) {
    plVar6 = plVar12->next;
    plVar7 = plVar12;
    if (plVar12->next == (lws_h2_protocol_send *)0x0) {
      *pplVar14 = (lws_h2_protocol_send *)0x0;
      plVar6 = (lws_h2_protocol_send *)0x0;
      plVar7 = (lws_h2_protocol_send *)pplVar14;
      ptr = plVar12;
    }
  }
  if (ptr == (lws_h2_protocol_send *)0x0) {
    return 1;
  }
  iVar15 = 0;
  iVar9 = 0;
  _lws_log(8,"%s: %p: %d\n","lws_h2_do_pps_send",wsi);
  uVar5 = set._16_8_;
  switch(*(http2_hpack_state *)((long)ptr + 8)) {
  case HPKS_IDX_EXT:
    uVar8 = 0;
    for (lVar16 = -8; lVar16 != 0; lVar16 = lVar16 + 1) {
      if ((plVar3->peer_set).s[lVar16] != lws_h2_stock_settings.s[lVar16]) {
        _lws_log(0x10,"sending SETTING %d 0x%x\n",lVar16 + 9U & 0xffffffff,
                 (ulong)(((wsi->h2).h2n)->peer_set).s[lVar16]);
        set[(long)(int)uVar8 + 0x10] = '\0';
        set[(long)(int)uVar8 + 0x11] = (uint8_t)(lVar16 + 9U);
        plVar4 = (wsi->h2).h2n;
        set[(long)(int)uVar8 + 0x12] = *(uint8_t *)((long)(plVar4->peer_set).s + lVar16 * 4 + 3);
        set[(long)(int)uVar8 + 0x13] = *(uint8_t *)((long)(plVar4->peer_set).s + lVar16 * 4 + 2);
        set[(long)(int)uVar8 + 0x14] = *(uint8_t *)((long)(plVar4->peer_set).s + lVar16 * 4 + 1);
        set[(long)(int)uVar8 + 0x15] = (uint8_t)(plVar4->peer_set).s[lVar16];
        uVar8 = uVar8 + 6;
      }
    }
    iVar15 = 0;
    uVar10 = lws_h2_frame_write(wsi,4,0,0,uVar8,set + 0x10);
    if (uVar10 == uVar8) goto switchD_0012a745_default;
    uVar13 = (ulong)uVar8;
    goto LAB_0012aaa3;
  case HPKS_HLEN:
    iVar15 = 0;
    uVar10 = lws_h2_frame_write(wsi,4,1,0,0,buf);
    if (uVar10 == 0) {
      wsi->field_0x2dc = wsi->field_0x2dc & 0xbf;
      if ((short)wsi->wsistate != 0x30d) goto switchD_0012a745_default;
      lwsi_set_state(wsi,0x119);
      (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
      plVar11 = lws_get_network_wsi(wsi);
      iVar9 = lws_is_ssl(plVar11);
      if (iVar9 != 0) goto switchD_0012a745_default;
      plVar11 = lws_wsi_server_new(wsi->vhost,wsi,1);
      plVar3->swsi = plVar11;
      if (plVar11 != (lws *)0x0) {
        (plVar11->http).ah = (wsi->http).ah;
        (wsi->http).ah = (allocated_headers *)0x0;
        iVar15 = 0;
        _lws_log(8,"%s: inherited headers %p\n","lws_h2_do_pps_send",(plVar11->http).ah);
        (plVar3->swsi->txc).tx_cr = (plVar3->our_set).s[4];
        _lws_log(8,"initial tx credit on conn %p: %d\n");
        puVar1 = &(plVar3->swsi->h2).field_0x11;
        *puVar1 = *puVar1 | 0x10;
        puVar1 = &(plVar3->swsi->h2).field_0x11;
        *puVar1 = *puVar1 | 1;
        _lws_log(8,"servicing initial http request\n");
        iVar9 = lws_http_action(plVar3->swsi);
        if (iVar9 == 0) goto switchD_0012a745_default;
      }
    }
    else {
      _lws_log(1,"ack tells %d\n",(ulong)uVar10);
    }
    break;
  case HPKS_HLEN_EXT:
    format = "sending PING\n";
    goto LAB_0012a874;
  case HPKS_DATA:
    iVar9 = 1;
    format = "sending PONG\n";
LAB_0012a874:
    _lws_log(8,format);
    set._16_8_ = *(undefined8 *)((long)ptr + 0xc);
    iVar9 = lws_h2_frame_write(wsi,6,iVar9,0,8,buf);
    iVar15 = 0;
    if (iVar9 == 8) goto switchD_0012a745_default;
    break;
  case HPKS_DATA|HPKS_IDX_EXT:
    lVar16 = 0;
    _lws_log(8,"LWS_H2_PPS_GOAWAY\n");
    uVar10 = *(uint32_t *)((long)ptr + 0x2c);
    uVar8 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    uVar10 = *(uint32_t *)((long)ptr + 0x30);
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    set[0x14] = (char)uVar10;
    set[0x15] = (char)(uVar10 >> 8);
    set[0x16] = (char)(uVar10 >> 0x10);
    set[0x17] = (char)(uVar10 >> 0x18);
    set[0x10] = (char)uVar8;
    set[0x11] = (char)(uVar8 >> 8);
    set[0x12] = (char)(uVar8 >> 0x10);
    set[0x13] = (char)(uVar8 >> 0x18);
    while( true ) {
      uVar2 = *(uint8_t *)((long)ptr + lVar16 + 0xc);
      if ((uVar2 == '\0') || (0x1f < (uint)lVar16)) break;
      set[lVar16 + 0x18] = uVar2;
      lVar16 = lVar16 + 1;
    }
    plVar3->field_0xa8 = plVar3->field_0xa8 | 0x20;
    uVar10 = lws_h2_frame_write(wsi,7,0,0,(uint)lVar16 + 8,buf);
    if (uVar10 != 4) goto LAB_0012aa95;
    break;
  case HPKS_DATA|HPKS_HLEN:
    iVar15 = 0;
    _lws_log(8,"LWS_H2_PPS_RST_STREAM\n");
    uVar5 = set._16_8_;
    set[0x11] = *(undefined1 *)((long)ptr + 0x12);
    set[0x10] = *(undefined1 *)((long)ptr + 0x13);
    set[0x12] = *(undefined1 *)((long)ptr + 0x11);
    set._20_4_ = SUB84(uVar5,4);
    set[0x13] = *(uint8_t *)((long)ptr + 0x10);
    uVar10 = lws_h2_frame_write(wsi,3,0,*(http2_hpack_type *)((long)ptr + 0xc),4,buf);
    if (uVar10 == 4) {
      plVar11 = lws_wsi_mux_from_id(wsi,*(http2_hpack_type *)((long)ptr + 0xc));
      if (plVar11 != (lws *)0x0) {
        iVar15 = 0;
        _lws_log(0x10,"%s: closing cwsi %p %s %s (wsi %p)\n","lws_h2_do_pps_send",plVar11,
                 plVar11->role_ops->name,plVar11->protocol->name,wsi);
        lws_close_free_wsi(plVar11,LWS_CLOSE_STATUS_NOSTATUS,"reset stream");
      }
      goto switchD_0012a745_default;
    }
    goto LAB_0012aa95;
  case HPKS_DATA|HPKS_HLEN_EXT:
    iVar15 = 0;
    _lws_log(8,"Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
             (ulong)*(http2_hpack_type *)((long)ptr + 0xc),(ulong)*(uint *)((long)ptr + 0x10));
    set._16_8_ = CONCAT71(set._17_7_,*(undefined1 *)((long)ptr + 0x13)) & 0xffffffffffffff7f;
    uVar5 = set._16_8_;
    set[0x11] = *(undefined1 *)((long)ptr + 0x12);
    set[0x12] = *(undefined1 *)((long)ptr + 0x11);
    set._20_4_ = SUB84(uVar5,4);
    set[0x13] = *(uint8_t *)((long)ptr + 0x10);
    uVar10 = lws_h2_frame_write(wsi,8,0,*(http2_hpack_type *)((long)ptr + 0xc),4,buf);
    if (uVar10 == 4) goto switchD_0012a745_default;
    goto LAB_0012aa95;
  case 8:
    set[0x12] = *(undefined1 *)((long)ptr + 0x13);
    set[0x10] = '\0';
    set[0x11] = '\x04';
    set[0x13] = *(undefined1 *)((long)ptr + 0x12);
    set[0x14] = *(undefined1 *)((long)ptr + 0x11);
    set._22_2_ = SUB82(uVar5,6);
    set[0x15] = *(uint8_t *)((long)ptr + 0x10);
    iVar15 = 0;
    _lws_log(0x10,"%s: resetting initial window to %d\n","lws_h2_do_pps_send");
    uVar10 = lws_h2_frame_write(wsi,4,0,0,6,buf);
    if (uVar10 == 6) goto switchD_0012a745_default;
LAB_0012aa95:
    uVar13 = 0;
LAB_0012aaa3:
    _lws_log(8,"send %d %d\n",(ulong)uVar10,uVar13);
    break;
  default:
    goto switchD_0012a745_default;
  }
  iVar15 = 1;
switchD_0012a745_default:
  lws_realloc(ptr,0,"lws_free");
  return iVar15;
}

Assistant:

int lws_h2_do_pps_send(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps = NULL;
	struct lws *cwsi;
	uint8_t set[LWS_PRE + 64], *p = &set[LWS_PRE], *q;
	int n, m = 0, flags = 0;

	if (!h2n)
		return 1;

	/* get the oldest pps */

	lws_start_foreach_llp(struct lws_h2_protocol_send **, pps1, h2n->pps) {
		if ((*pps1)->next == NULL) { /* we are the oldest in the list */
			pps = *pps1; /* remove us from the list */
			*pps1 = NULL;
			continue;
		}
	} lws_end_foreach_llp(pps1, next);

	if (!pps)
		return 1;

	lwsl_info("%s: %p: %d\n", __func__, wsi, pps->type);

	switch (pps->type) {

	case LWS_H2_PPS_MY_SETTINGS:

		/*
		 * if any of our settings varies from h2 "default defaults"
		 * then we must inform the peer
		 */
		for (n = 1; n < H2SET_COUNT; n++)
			if (h2n->our_set.s[n] != lws_h2_defaults.s[n]) {
				lwsl_debug("sending SETTING %d 0x%x\n", n,
					   (unsigned int)
						   wsi->h2.h2n->our_set.s[n]);

				lws_h2_set_bin(wsi, n, &set[LWS_PRE + m]);
				m += sizeof(h2n->one_setting);
			}
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, m,
		     		       &set[LWS_PRE]);
		if (n != m) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_SETTINGS_INITIAL_UPDATE_WINDOW:
		q = &set[LWS_PRE];
		*q++ = H2SET_INITIAL_WINDOW_SIZE >> 8;
		*q++ = H2SET_INITIAL_WINDOW_SIZE;
		*q++ = pps->u.update_window.credit >> 24;
		*q++ = pps->u.update_window.credit >> 16;
		*q++ = pps->u.update_window.credit >> 8;
		*q = pps->u.update_window.credit;

		lwsl_debug("%s: resetting initial window to %d\n", __func__,
				(int)pps->u.update_window.credit);

		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, 6,
		     		       &set[LWS_PRE]);
		if (n != 6) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_ACK_SETTINGS:
		/* send ack ... always empty */
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS, 1,
				       LWS_H2_STREAM_ID_MASTER, 0,
				       &set[LWS_PRE]);
		if (n) {
			lwsl_err("ack tells %d\n", n);
			goto bail;
		}
		wsi->h2_acked_settings = 0;
		/* this is the end of the preface dance then? */
		if (lwsi_state(wsi) == LRS_H2_AWAIT_SETTINGS) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			if (lws_is_ssl(lws_get_network_wsi(wsi)))
				break;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi, 1);
			if (!h2n->swsi)
				goto bail;

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
			wsi->http.ah = NULL;

			lwsl_info("%s: inherited headers %p\n", __func__,
				  h2n->swsi->http.ah);
			h2n->swsi->txc.tx_cr =
				h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("initial tx credit on conn %p: %d\n",
				  h2n->swsi, (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;
			/* demanded by HTTP2 */
			h2n->swsi->h2.END_STREAM = 1;
			lwsl_info("servicing initial http request\n");

#if defined(LWS_WITH_SERVER_STATUS)
			wsi->vhost->conn_stats.h2_trans++;
#endif
#if defined(LWS_WITH_SERVER)
			if (lws_http_action(h2n->swsi))
				goto bail;
#endif
			break;
		}
		break;

	/*
	 * h2 only has PING... ACK = 0 = ping, ACK = 1 = pong
	 */

	case LWS_H2_PPS_PING:
	case LWS_H2_PPS_PONG:
		if (pps->type == LWS_H2_PPS_PING)
			lwsl_info("sending PING\n");
		else {
			lwsl_info("sending PONG\n");
			flags = LWS_H2_FLAG_SETTINGS_ACK;
		}

		memcpy(&set[LWS_PRE], pps->u.ping.ping_payload, 8);
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_PING, flags,
				       LWS_H2_STREAM_ID_MASTER, 8,
				       &set[LWS_PRE]);
		if (n != 8)
			goto bail;

		break;

	case LWS_H2_PPS_GOAWAY:
		lwsl_info("LWS_H2_PPS_GOAWAY\n");
		*p++ = pps->u.ga.highest_sid >> 24;
		*p++ = pps->u.ga.highest_sid >> 16;
		*p++ = pps->u.ga.highest_sid >> 8;
		*p++ = pps->u.ga.highest_sid;
		*p++ = pps->u.ga.err >> 24;
		*p++ = pps->u.ga.err >> 16;
		*p++ = pps->u.ga.err >> 8;
		*p++ = pps->u.ga.err;
		q = (unsigned char *)pps->u.ga.str;
		n = 0;
		while (*q && n++ < (int)sizeof(pps->u.ga.str))
			*p++ = *q++;
		h2n->we_told_goaway = 1;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_GOAWAY, 0,
				       LWS_H2_STREAM_ID_MASTER,
				       lws_ptr_diff(p, &set[LWS_PRE]),
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		goto bail;

	case LWS_H2_PPS_RST_STREAM:
		lwsl_info("LWS_H2_PPS_RST_STREAM\n");
		*p++ = pps->u.rs.err >> 24;
		*p++ = pps->u.rs.err >> 16;
		*p++ = pps->u.rs.err >> 8;
		*p++ = pps->u.rs.err;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_RST_STREAM,
				       0, pps->u.rs.sid, 4, &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		cwsi = lws_wsi_mux_from_id(wsi, pps->u.rs.sid);
		if (cwsi) {
			lwsl_debug("%s: closing cwsi %p %s %s (wsi %p)\n",
				   __func__, cwsi, cwsi->role_ops->name,
				   cwsi->protocol->name, wsi);
			lws_close_free_wsi(cwsi, 0, "reset stream");
		}
		break;

	case LWS_H2_PPS_UPDATE_WINDOW:
		lwsl_info("Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
			    (int)pps->u.update_window.sid,
			    (int)pps->u.update_window.credit);
		*p++ = (pps->u.update_window.credit >> 24) & 0x7f; /* 31b */
		*p++ = pps->u.update_window.credit >> 16;
		*p++ = pps->u.update_window.credit >> 8;
		*p++ = pps->u.update_window.credit;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_WINDOW_UPDATE,
				       0, pps->u.update_window.sid, 4,
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	default:
		break;
	}

	lws_free(pps);

	return 0;

bail:
	lws_free(pps);

	return 1;
}